

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::util_TrimString::test_method(util_TrimString *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  string *psVar2;
  string_view *psVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string msg;
  string_view pattern;
  const_string msg_00;
  const_string msg_01;
  string_view pattern_00;
  const_string msg_02;
  const_string msg_03;
  string_view pattern_01;
  const_string msg_04;
  const_string msg_05;
  string_view pattern_02;
  const_string msg_06;
  const_string msg_07;
  string_view pattern_03;
  const_string msg_08;
  const_string msg_09;
  string_view pattern_04;
  const_string msg_10;
  string_view str;
  string_view pattern_05;
  string_view str_00;
  string_view pattern_06;
  string_view str_01;
  string_view pattern_07;
  string_view str_02;
  string_view pattern_08;
  string_view str_03;
  string_view pattern_09;
  string_view str_04;
  string_view pattern_10;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined **local_f8;
  undefined1 local_f0;
  undefined1 *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  undefined2 *local_b8;
  undefined8 local_b0;
  undefined2 local_a8 [8];
  string_view local_98;
  undefined2 local_88;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined2 local_84;
  undefined1 uStack_82;
  undefined1 local_81;
  char *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined1 local_60;
  string_view local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x138;
  file.m_begin = (iterator)&local_c8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d8,msg);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_100 = "";
  pattern._M_str = in_R9;
  pattern._M_len = (size_t)" \f\n\r\t\v";
  str._M_str = (char *)0x6;
  str._M_len = (size_t)" foo bar ";
  util::TrimString_abi_cxx11_((string *)&local_58,(util *)0x9,str,pattern);
  pvVar1 = (iterator)0x2;
  psVar2 = (string *)&local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
            (&local_f8,&local_108,0x138,1,2,psVar2,"TrimString(\" foo bar \")","foo bar",
             "\"foo bar\"");
  std::__cxx11::string::~string((string *)&local_58);
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x139;
  file_00.m_begin = (iterator)&local_118;
  msg_00.m_end = (iterator)psVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_128,
             msg_00);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_130 = "";
  pattern_05._M_str = " \f\n\r\t\v";
  pattern_05._M_len = 6;
  str_05._M_str = "\t \n  \n \f\n\r\t\v\tfoo \n \f\n\r\t\v\tbar\t  \n \f\n\r\t\v\t\n ";
  str_05._M_len = 0x29;
  local_58 = util::TrimStringView(str_05,pattern_05);
  pvVar1 = (iterator)0x2;
  psVar2 = (string *)&local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::basic_string_view<char,std::char_traits<char>>,char[16]>
            (&local_f8,&local_138,0x139,1,2,psVar2,
             "TrimStringView(\"\\t \\n  \\n \\f\\n\\r\\t\\v\\tfoo \\n \\f\\n\\r\\t\\v\\tbar\\t  \\n \\f\\n\\r\\t\\v\\t\\n \")"
             ,"foo \n \f\n\r\t\v\tbar","\"foo \\n \\f\\n\\r\\t\\v\\tbar\"");
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x13a;
  file_01.m_begin = (iterator)&local_148;
  msg_01.m_end = (iterator)psVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_158,
             msg_01);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_160 = "";
  pattern_00._M_str = (char *)psVar2;
  pattern_00._M_len = (size_t)" \f\n\r\t\v";
  str_00._M_str = (char *)0x6;
  str_00._M_len = (size_t)"\t \n foo \n\tbar\t \n ";
  util::TrimString_abi_cxx11_((string *)&local_58,(util *)0x11,str_00,pattern_00);
  pvVar1 = (iterator)0x2;
  psVar2 = (string *)&local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (&local_f8,&local_168,0x13a,1,2,psVar2,"TrimString(\"\\t \\n foo \\n\\tbar\\t \\n \")",
             "foo \n\tbar","\"foo \\n\\tbar\"");
  std::__cxx11::string::~string((string *)&local_58);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x13b;
  file_02.m_begin = (iterator)&local_178;
  msg_02.m_end = (iterator)psVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_188,
             msg_02);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_190 = "";
  pattern_06._M_str = "fobar";
  pattern_06._M_len = 5;
  str_06._M_str = "\t \n foo \n\tbar\t \n ";
  str_06._M_len = 0x11;
  local_58 = util::TrimStringView(str_06,pattern_06);
  pvVar1 = (iterator)0x2;
  psVar2 = (string *)&local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::basic_string_view<char,std::char_traits<char>>,char[18]>
            (&local_f8,&local_198,0x13b,1,2,psVar2,
             "TrimStringView(\"\\t \\n foo \\n\\tbar\\t \\n \", \"fobar\")",
             "\t \n foo \n\tbar\t \n ","\"\\t \\n foo \\n\\tbar\\t \\n \"");
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x13c;
  file_03.m_begin = (iterator)&local_1a8;
  msg_03.m_end = (iterator)psVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1b8,
             msg_03);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1c0 = "";
  pattern_01._M_str = (char *)psVar2;
  pattern_01._M_len = (size_t)" \f\n\r\t\v";
  str_01._M_str = (char *)0x6;
  str_01._M_len = (size_t)"foo bar";
  util::TrimString_abi_cxx11_((string *)&local_58,(util *)0x7,str_01,pattern_01);
  pvVar1 = (iterator)0x2;
  psVar2 = (string *)&local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
            (&local_f8,&local_1c8,0x13c,1,2,psVar2,"TrimString(\"foo bar\")","foo bar","\"foo bar\""
            );
  std::__cxx11::string::~string((string *)&local_58);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x13d;
  file_04.m_begin = (iterator)&local_1d8;
  msg_04.m_end = (iterator)psVar2;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1e8,
             msg_04);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1f0 = "";
  pattern_07._M_str = "fobar";
  pattern_07._M_len = 5;
  str_07._M_str = "foo bar";
  str_07._M_len = 7;
  local_58 = util::TrimStringView(str_07,pattern_07);
  pvVar1 = (iterator)0x2;
  psVar2 = (string *)&local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            (&local_f8,&local_1f8,0x13d,1,2,psVar2,"TrimStringView(\"foo bar\", \"fobar\")"," ",
             "\" \"");
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x13e;
  file_05.m_begin = (iterator)&local_208;
  msg_05.m_end = (iterator)psVar2;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_218,
             msg_05);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_220 = "";
  local_68 = 0x2000206f6f662000;
  local_70 = 8;
  local_60 = 0;
  pattern_02._M_str = (char *)psVar2;
  pattern_02._M_len = (size_t)" \f\n\r\t\v";
  str_02._M_str = (char *)0x6;
  str_02._M_len = (size_t)&local_68;
  local_78 = (char *)&local_68;
  util::TrimString_abi_cxx11_((string *)&local_58,(util *)0x8,str_02,pattern_02);
  local_88 = 0x2000;
  uStack_86 = 0x66;
  uStack_85 = 0x6f;
  local_84 = 0x206f;
  uStack_82 = 0;
  local_98._M_str = (char *)0x7;
  local_98._M_len = (size_t)&local_88;
  local_81 = 0;
  pvVar1 = (iterator)0x2;
  psVar2 = (string *)&local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_228,0x13e,1,2,psVar2,"TrimString(std::string(\"\\0 foo \\0 \", 8))",
             &local_98,"std::string(\"\\0 foo \\0\", 7)");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x13f;
  file_06.m_begin = (iterator)&local_238;
  msg_06.m_end = (iterator)psVar2;
  msg_06.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_248,
             msg_06);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_250 = "";
  local_48._M_allocated_capacity._0_4_ = 0x6f6f6620;
  local_48._M_allocated_capacity._4_2_ = 0x20;
  local_58._M_str = (char *)0x5;
  pattern_08._M_str = " \f\n\r\t\v";
  pattern_08._M_len = 6;
  str_08._M_str = (char *)&local_48;
  str_08._M_len = 5;
  local_58._M_len = (size_t)&local_48;
  local_98 = util::TrimStringView(str_08,pattern_08);
  local_68._0_4_ = 0x6f6f66;
  local_70 = 3;
  pvVar1 = (iterator)0x2;
  psVar3 = &local_98;
  local_78 = (char *)&local_68;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
            (&local_f8,&local_258,0x13f,1,2,&local_98,"TrimStringView(std::string(\" foo \", 5))",
             (string *)&local_78,"std::string(\"foo\", 3)");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x140;
  file_07.m_begin = (iterator)&local_268;
  msg_07.m_end = (iterator)psVar3;
  msg_07.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_278,
             msg_07);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_280 = "";
  local_70 = 6;
  local_68._0_7_ = 0xa0a00000909;
  pattern_03._M_str = (char *)psVar3;
  pattern_03._M_len = (size_t)" \f\n\r\t\v";
  str_03._M_str = (char *)0x6;
  str_03._M_len = (size_t)&local_68;
  local_78 = (char *)&local_68;
  util::TrimString_abi_cxx11_((string *)&local_58,(util *)0x6,str_03,pattern_03);
  local_88 = 0;
  local_98._M_str = (char *)0x2;
  local_98._M_len = (size_t)&local_88;
  uStack_86 = 0;
  pvVar1 = (iterator)0x2;
  psVar2 = (string *)&local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_288,0x140,1,2,psVar2,
             "TrimString(std::string(\"\\t\\t\\0\\0\\n\\n\", 6))",&local_98,
             "std::string(\"\\0\\0\", 2)");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x141;
  file_08.m_begin = (iterator)&local_298;
  msg_08.m_end = (iterator)psVar2;
  msg_08.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2a8,
             msg_08);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2b0 = "";
  local_48._M_allocated_capacity._0_4_ = 0x2030405;
  local_48._M_allocated_capacity._4_2_ = 1;
  local_58._M_str = (char *)0x6;
  local_48._M_local_buf[6] = '\0';
  pattern_09._M_str = " \f\n\r\t\v";
  pattern_09._M_len = 6;
  str_09._M_str = (char *)&local_48;
  str_09._M_len = 6;
  local_58._M_len = (size_t)&local_48;
  local_98 = util::TrimStringView(str_09,pattern_09);
  psVar3 = &local_98;
  local_70 = 6;
  local_68._0_7_ = 0x102030405;
  pvVar1 = (iterator)0x2;
  local_78 = (char *)&local_68;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
            (&local_f8,&local_2b8,0x141,1,2,psVar3,
             "TrimStringView(std::string(\"\\x05\\x04\\x03\\x02\\x01\\x00\", 6))",
             (string *)&local_78,"std::string(\"\\x05\\x04\\x03\\x02\\x01\\x00\", 6)");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x142;
  file_09.m_begin = (iterator)&local_2c8;
  msg_09.m_end = (iterator)psVar3;
  msg_09.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2d8,
             msg_09);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2e0 = "";
  local_70 = 6;
  local_68._0_7_ = 0x102030405;
  local_88 = 0x405;
  uStack_86 = 3;
  uStack_85 = 2;
  local_84 = 1;
  local_98._M_str = (char *)0x5;
  local_98._M_len = (size_t)&local_88;
  pattern_04._M_str = (char *)psVar3;
  pattern_04._M_len = (size_t)&local_88;
  str_04._M_str = (char *)0x5;
  str_04._M_len = (size_t)&local_68;
  local_78 = (char *)&local_68;
  util::TrimString_abi_cxx11_((string *)&local_58,(util *)0x6,str_04,pattern_04);
  local_b8 = local_a8;
  local_a8[0] = 0;
  local_b0 = 1;
  pvVar1 = (iterator)0x2;
  psVar2 = (string *)&local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_2e8,0x142,1,2,psVar2,
             "TrimString(std::string(\"\\x05\\x04\\x03\\x02\\x01\\x00\", 6), std::string(\"\\x05\\x04\\x03\\x02\\x01\", 5))"
             ,&local_b8,"std::string(\"\\0\", 1)");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x143;
  file_10.m_begin = (iterator)&local_2f8;
  msg_10.m_end = (iterator)psVar2;
  msg_10.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_308,
             msg_10);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_310 = "";
  local_48._M_allocated_capacity._0_4_ = 0x2030405;
  local_48._M_allocated_capacity._4_2_ = 1;
  local_58._M_str = (char *)0x6;
  local_58._M_len = (size_t)&local_48;
  local_48._M_local_buf[6] = '\0';
  local_78 = (char *)&local_68;
  local_70 = 6;
  local_68 = CONCAT17(local_68._7_1_,0x102030405);
  pattern_10._M_str = local_78;
  pattern_10._M_len = 6;
  str_10._M_str = (char *)&local_48;
  str_10._M_len = 6;
  local_98 = util::TrimStringView(str_10,pattern_10);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::basic_string_view<char,std::char_traits<char>>,char[1]>
            (&local_f8,&local_318,0x143,1,2,&local_98,
             "TrimStringView(std::string(\"\\x05\\x04\\x03\\x02\\x01\\x00\", 6), std::string(\"\\x05\\x04\\x03\\x02\\x01\\x00\", 6))"
             ,"","\"\"");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_TrimString)
{
    BOOST_CHECK_EQUAL(TrimString(" foo bar "), "foo bar");
    BOOST_CHECK_EQUAL(TrimStringView("\t \n  \n \f\n\r\t\v\tfoo \n \f\n\r\t\v\tbar\t  \n \f\n\r\t\v\t\n "), "foo \n \f\n\r\t\v\tbar");
    BOOST_CHECK_EQUAL(TrimString("\t \n foo \n\tbar\t \n "), "foo \n\tbar");
    BOOST_CHECK_EQUAL(TrimStringView("\t \n foo \n\tbar\t \n ", "fobar"), "\t \n foo \n\tbar\t \n ");
    BOOST_CHECK_EQUAL(TrimString("foo bar"), "foo bar");
    BOOST_CHECK_EQUAL(TrimStringView("foo bar", "fobar"), " ");
    BOOST_CHECK_EQUAL(TrimString(std::string("\0 foo \0 ", 8)), std::string("\0 foo \0", 7));
    BOOST_CHECK_EQUAL(TrimStringView(std::string(" foo ", 5)), std::string("foo", 3));
    BOOST_CHECK_EQUAL(TrimString(std::string("\t\t\0\0\n\n", 6)), std::string("\0\0", 2));
    BOOST_CHECK_EQUAL(TrimStringView(std::string("\x05\x04\x03\x02\x01\x00", 6)), std::string("\x05\x04\x03\x02\x01\x00", 6));
    BOOST_CHECK_EQUAL(TrimString(std::string("\x05\x04\x03\x02\x01\x00", 6), std::string("\x05\x04\x03\x02\x01", 5)), std::string("\0", 1));
    BOOST_CHECK_EQUAL(TrimStringView(std::string("\x05\x04\x03\x02\x01\x00", 6), std::string("\x05\x04\x03\x02\x01\x00", 6)), "");
}